

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int pattern_search(FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,int search_step,
                  int do_init_search,int *cost_list,FULLPEL_MV *best_mv,
                  FULLPEL_MV_STATS *best_mv_stats)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  buf_2d *pbVar4;
  buf_2d *pbVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int16_t iVar10;
  FULLPEL_MV FVar11;
  FullMvLimits *pFVar12;
  int iVar13;
  int16_t iVar14;
  short sVar15;
  ulong uVar16;
  short sVar17;
  ulong uVar18;
  uint *puVar19;
  int i;
  ulong uVar20;
  int iVar21;
  char cVar22;
  int *piVar23;
  int best_site_1;
  uint local_c8;
  uint local_c4;
  uint8_t *local_c0;
  FULLPEL_MOTION_SEARCH_PARAMS *local_b8;
  uint local_ac;
  MV_COST_PARAMS *local_a8;
  uint local_9c;
  search_site_config *local_98;
  int best_site;
  int local_88;
  int local_84;
  ulong local_80;
  uint local_74;
  uint *local_70;
  FullMvLimits *local_68;
  FULLPEL_MV *local_60;
  ulong local_58;
  int local_50;
  int16_t local_4a;
  ulong local_48;
  long local_40;
  FULLPEL_MV start_mv_local;
  
  pbVar4 = (ms_params->ms_buffers).ref;
  pbVar5 = (ms_params->ms_buffers).src;
  local_98 = ms_params->search_sites;
  iVar7 = pbVar4->stride;
  local_48 = CONCAT44(local_48._4_4_,local_98->searches_per_step[0]);
  local_a8 = &ms_params->mv_cost_params;
  iVar8 = 10;
  if (search_step < 10) {
    iVar8 = search_step;
  }
  local_ac = pattern_search::search_steps[iVar8];
  local_68 = &ms_params->mv_limits;
  local_b8 = ms_params;
  local_50 = do_init_search;
  start_mv_local = start_mv;
  clamp_fullmv(&start_mv_local,local_68);
  iVar10 = start_mv_local.col;
  local_74 = CONCAT22(local_74._2_2_,start_mv_local.row);
  local_9c = (uint)start_mv_local.row;
  iVar21 = (int)start_mv_local.col;
  iVar8 = iVar7;
  if (cost_list != (int *)0x0) {
    cost_list[4] = 0x7fffffff;
    cost_list[0] = 0x7fffffff;
    cost_list[1] = 0x7fffffff;
    cost_list[2] = 0x7fffffff;
    cost_list[3] = 0x7fffffff;
    iVar8 = pbVar4->stride;
  }
  local_70 = (uint *)cost_list;
  uVar6 = (*local_b8->sdf)(pbVar5->buf,pbVar5->stride,pbVar4->buf + (int)(iVar8 * local_9c + iVar21)
                           ,iVar7);
  local_c8 = uVar6;
  iVar7 = mvsad_err_cost_(&start_mv_local,local_a8);
  local_c4 = iVar7 + uVar6;
  local_c0 = pbVar4->buf + (int)(pbVar4->stride * local_9c + iVar21);
  pFVar12 = local_68;
  local_60 = best_mv;
  if (local_50 == 0) {
    uVar16 = 0xffffffffffffffff;
    uVar18 = (ulong)local_ac;
  }
  else {
    local_40 = (long)(int)local_ac;
    local_4a = iVar10;
    local_80 = CONCAT44(local_80._4_4_,CONCAT22(iVar10,(undefined2)local_74));
    uVar18 = 0xffffffffffffffff;
    uVar16 = 0xffffffff;
    for (uVar20 = 0; uVar6 = (uint)uVar18, (long)uVar20 <= local_40; uVar20 = uVar20 + 1) {
      best_site = -1;
      iVar7 = check_bounds(pFVar12,local_9c,iVar21,1 << ((byte)uVar20 & 0x1f));
      uVar2 = local_98->searches_per_step[uVar20];
      iVar8 = (int)uVar20;
      if (iVar7 == 0) {
        calc_sad_update_bestmv
                  (local_b8,local_a8,best_mv,local_80._0_4_,local_c0,&local_c4,&local_c8,iVar8,
                   &best_site,uVar2,0,(int *)0x0);
      }
      else {
        iVar13 = (int)uVar2 >> 2;
        iVar7 = 0;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        local_ac = uVar6;
        local_58 = (ulong)uVar2;
        for (; iVar13 << 2 != iVar7; iVar7 = iVar7 + 4) {
          calc_sad4_update_bestmv
                    (local_b8,local_a8,best_mv,local_80._0_4_,local_c0,&local_c4,&local_c8,iVar8,
                     &best_site,iVar7,(int *)0x0);
        }
        calc_sad_update_bestmv
                  (local_b8,local_a8,best_mv,local_80._0_4_,local_c0,&local_c4,&local_c8,iVar8,
                   &best_site,local_98->searches_per_step[uVar20] % 4,(uint)local_58 & 0xfffffffc,
                   (int *)0x0);
        uVar18 = (ulong)local_ac;
        pFVar12 = local_68;
      }
      if (best_site != -1) {
        uVar18 = uVar20;
      }
      uVar18 = uVar18 & 0xffffffff;
      if (best_site != -1) {
        uVar16 = (ulong)(uint)best_site;
      }
    }
    if (uVar6 == 0xffffffff) {
      cVar22 = '\x01';
      iVar14 = (int16_t)local_74;
      iVar10 = local_4a;
      goto LAB_001c3885;
    }
    iVar7 = (int)uVar16;
    local_9c = local_9c + (int)local_98->site[(int)uVar6][iVar7].mv.row;
    iVar21 = iVar21 + local_98->site[(int)uVar6][iVar7].mv.col;
    local_c0 = local_c0 + local_98->site[(int)uVar6][iVar7].offset;
  }
  local_74 = (uint)((int)local_48 == 4 && local_70 != (uint *)0x0);
  best_site_1 = -1;
  local_ac = (uint)uVar18;
  uVar20 = uVar18 & 0xffffffff;
  uVar6 = local_9c;
  while( true ) {
    iVar7 = (int)uVar20;
    if (iVar7 < (int)local_74) break;
    local_80 = uVar20;
    if ((local_50 == 0) || (iVar7 != (int)uVar18)) {
      iVar8 = 1 << ((byte)uVar20 & 0x1f);
      local_40 = CONCAT44(local_40._4_4_,iVar8);
      iVar8 = check_bounds(pFVar12,uVar6,iVar21,iVar8);
      uVar3 = local_ac;
      uVar2 = local_98->searches_per_step[local_80];
      local_9c = uVar6;
      if (iVar8 == 0) {
        calc_sad_update_bestmv
                  (local_b8,local_a8,best_mv,(FULLPEL_MV)(uVar6 & 0xffff | iVar21 << 0x10),local_c0,
                   &local_c4,&local_c8,iVar7,&best_site_1,uVar2,0,(int *)0x0);
        uVar3 = local_ac;
      }
      else {
        local_58 = CONCAT44(local_58._4_4_,iVar21);
        FVar11 = (FULLPEL_MV)(uVar6 & 0xffff | iVar21 << 0x10);
        iVar21 = 0;
        iVar8 = (int)uVar2 >> 2;
        if ((int)uVar2 >> 2 < 1) {
          iVar8 = iVar21;
        }
        local_48 = (ulong)uVar2;
        for (; best_mv = local_60, iVar8 << 2 != iVar21; iVar21 = iVar21 + 4) {
          calc_sad4_update_bestmv
                    (local_b8,local_a8,local_60,FVar11,local_c0,&local_c4,&local_c8,iVar7,
                     &best_site_1,iVar21,(int *)0x0);
        }
        calc_sad_update_bestmv
                  (local_b8,local_a8,local_60,FVar11,local_c0,&local_c4,&local_c8,iVar7,&best_site_1
                   ,local_98->searches_per_step[local_80] % 4,(uint)local_48 & 0xfffffffc,(int *)0x0
                  );
        pFVar12 = local_68;
        iVar21 = (int)local_58;
      }
      lVar9 = (long)best_site_1;
      uVar6 = local_9c;
      if (lVar9 != -1) {
        uVar6 = local_9c + (int)local_98->site[local_80][lVar9].mv.row;
        iVar21 = iVar21 + local_98->site[local_80][lVar9].mv.col;
        local_c0 = local_c0 + local_98->site[local_80][lVar9].offset;
        uVar16 = (ulong)(uint)best_site_1;
        local_58 = uVar20;
        goto LAB_001c34d1;
      }
    }
    else {
      local_40 = CONCAT44(local_40._4_4_,1 << ((byte)uVar20 & 0x1f));
      local_58 = uVar20;
LAB_001c34d1:
      while( true ) {
        best_site_1 = -1;
        local_88 = (int)uVar16;
        iVar7 = local_88;
        if (local_88 == 0) {
          iVar7 = local_98->searches_per_step[local_80];
        }
        best_site = iVar7 + -1;
        local_84 = local_88 + 1;
        if (local_88 == local_98->searches_per_step[local_80] + -1) {
          local_84 = 0;
        }
        piVar23 = (int *)0x1c351e;
        iVar7 = check_bounds(pFVar12,uVar6,iVar21,(int)local_40);
        FVar11 = (FULLPEL_MV)(uVar6 & 0xffff | iVar21 << 0x10);
        if (iVar7 == 0) {
          calc_sad_update_bestmv_with_indices
                    (local_b8,local_a8,best_mv,FVar11,local_c0,&local_c4,&local_c8,(int)local_58,
                     &best_site_1,(int)&best_site,(int *)0x0,piVar23);
        }
        else {
          calc_sad3_update_bestmv
                    (local_b8,local_a8,best_mv,FVar11,local_c0,&local_c4,&local_c8,(int)local_58,
                     &best_site_1,&best_site,(int *)0x0);
        }
        uVar20 = local_58;
        uVar3 = local_ac;
        if ((long)best_site_1 == -1) break;
        uVar16 = (ulong)(&best_site)[best_site_1];
        uVar6 = uVar6 + (int)local_98->site[local_80][uVar16].mv.row;
        iVar21 = iVar21 + local_98->site[local_80][uVar16].mv.col;
        local_c0 = local_c0 + local_98->site[local_80][uVar16].offset;
      }
    }
    uVar18 = (ulong)uVar3;
    uVar20 = (ulong)((int)uVar20 - 1);
  }
  cVar22 = iVar7 != 0;
  if (!(bool)cVar22) {
    local_80 = CONCAT71(local_80._1_7_,cVar22);
    *local_70 = local_c8;
    uVar20 = 0xffffffffffffffff;
    if ((local_50 == 0) || ((int)uVar18 != 0)) {
      iVar7 = check_bounds(local_68,uVar6,iVar21,1);
      FVar11 = (FULLPEL_MV)(uVar6 & 0xffff | iVar21 << 0x10);
      if (iVar7 == 0) {
        calc_sad_update_bestmv
                  (local_b8,local_a8,local_60,FVar11,local_c0,&local_c4,&local_c8,0,&best_site_1,4,0
                   ,(int *)local_70);
      }
      else {
        calc_sad4_update_bestmv
                  (local_b8,local_a8,local_60,FVar11,local_c0,&local_c4,&local_c8,0,&best_site_1,0,
                   (int *)local_70);
      }
      lVar9 = (long)best_site_1;
      if (lVar9 != -1) {
        uVar6 = uVar6 + (int)local_98->site[0][lVar9].mv.row;
        iVar21 = iVar21 + local_98->site[0][lVar9].mv.col;
        local_c0 = local_c0 + local_98->site[0][lVar9].offset;
        uVar20 = (ulong)(uint)best_site_1;
        uVar16 = (ulong)(uint)best_site_1;
      }
    }
    while (puVar19 = local_70, (int)uVar20 != -1) {
      best_site_1 = -1;
      local_88 = (int)uVar16;
      iVar7 = local_88;
      if (local_88 == 0) {
        iVar7 = local_98->searches_per_step[0];
      }
      best_site = iVar7 + -1;
      local_84 = local_88 + 1;
      if (local_88 == local_98->searches_per_step[0] + -1) {
        local_84 = 0;
      }
      local_70[1] = 0x7fffffff;
      local_70[2] = 0x7fffffff;
      local_70[3] = 0x7fffffff;
      local_70[4] = 0x7fffffff;
      local_70[(long)((local_88 + 2) % 4) + 1] = *local_70;
      *local_70 = local_c8;
      piVar23 = (int *)0x1c37b1;
      iVar7 = check_bounds(local_68,uVar6,iVar21,1);
      FVar11 = (FULLPEL_MV)(uVar6 & 0xffff | iVar21 << 0x10);
      if (iVar7 == 0) {
        calc_sad_update_bestmv_with_indices
                  (local_b8,local_a8,local_60,FVar11,local_c0,&local_c4,&local_c8,0,&best_site_1,
                   (int)&best_site,(int *)puVar19,piVar23);
      }
      else {
        calc_sad3_update_bestmv
                  (local_b8,local_a8,local_60,FVar11,local_c0,&local_c4,&local_c8,0,&best_site_1,
                   &best_site,(int *)puVar19);
      }
      uVar20 = (ulong)best_site_1;
      if (uVar20 != 0xffffffffffffffff) {
        uVar16 = (ulong)(&best_site)[uVar20];
        uVar6 = uVar6 + (int)local_98->site[0][uVar16].mv.row;
        iVar21 = iVar21 + local_98->site[0][uVar16].mv.col;
        local_c0 = local_c0 + local_98->site[0][uVar16].offset;
      }
    }
    best_mv = local_60;
    cVar22 = (char)local_80;
  }
  iVar14 = (int16_t)uVar6;
  iVar10 = (int16_t)iVar21;
LAB_001c3885:
  puVar19 = local_70;
  best_mv->row = iVar14;
  best_mv->col = iVar10;
  if (local_70 != (uint *)0x0) {
    best_site = *(int *)best_mv;
    local_c0 = (uint8_t *)CONCAT44(local_c0._4_4_,(uint)best_site >> 0x10);
    sVar15 = (short)best_site;
    if (cVar22 != '\0') {
      pbVar4 = (local_b8->ms_buffers).ref;
      pbVar5 = (local_b8->ms_buffers).src;
      iVar7 = pbVar4->stride;
      iVar8 = best_site >> 0x10;
      local_98 = (search_site_config *)CONCAT44(local_98._4_4_,iVar7);
      uVar6 = (*local_b8->sdf)(pbVar5->buf,pbVar5->stride,pbVar4->buf + (iVar7 * sVar15 + iVar8),
                               iVar7);
      *puVar19 = uVar6;
      iVar7 = check_bounds(local_68,(int)sVar15,iVar8,1);
      lVar9 = 0;
      if (iVar7 == 0) {
        for (; lVar9 != 4; lVar9 = lVar9 + 1) {
          sVar1 = (&calc_int_sad_list_neighbors)[lVar9 * 2];
          sVar17 = (&DAT_0043d382)[lVar9 * 2] + (short)local_c0;
          FVar11.col = sVar17;
          FVar11.row = sVar1 + sVar15;
          iVar7 = av1_is_fullmv_in_range(local_68,FVar11);
          if (iVar7 == 0) {
            uVar6 = 0x7fffffff;
          }
          else {
            uVar6 = (*local_b8->sdf)(pbVar5->buf,pbVar5->stride,
                                     pbVar4->buf +
                                     ((int)sVar17 + (int)(short)(sVar1 + sVar15) * pbVar4->stride),
                                     (int)local_98);
          }
          local_70[lVar9 + 1] = uVar6;
          puVar19 = local_70;
        }
      }
      else {
        for (; lVar9 != 4; lVar9 = lVar9 + 1) {
          uVar6 = (*local_b8->sdf)(pbVar5->buf,pbVar5->stride,
                                   pbVar4->buf +
                                   ((int)(short)((&DAT_0043d382)[lVar9 * 2] + (short)local_c0) +
                                   (int)(short)((&calc_int_sad_list_neighbors)[lVar9 * 2] + sVar15)
                                   * pbVar4->stride),(int)local_98);
          puVar19[lVar9 + 1] = uVar6;
        }
      }
    }
    iVar7 = mvsad_err_cost_((FULLPEL_MV *)&best_site,local_a8);
    *puVar19 = *puVar19 + iVar7;
    for (lVar9 = 0; best_mv = local_60, lVar9 != 4; lVar9 = lVar9 + 1) {
      uVar6 = puVar19[lVar9 + 1];
      if (uVar6 != 0x7fffffff) {
        best_site_1 = CONCAT22((&DAT_0043d382)[lVar9 * 2] + (short)local_c0,
                               (&calc_int_sad_list_neighbors)[lVar9 * 2] + sVar15);
        iVar7 = mvsad_err_cost_((FULLPEL_MV *)&best_site_1,local_a8);
        puVar19[lVar9 + 1] = iVar7 + uVar6;
      }
    }
  }
  iVar7 = get_mvpred_var_cost(local_b8,best_mv,best_mv_stats);
  return iVar7;
}

Assistant:

static int pattern_search(FULLPEL_MV start_mv,
                          const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                          int search_step, const int do_init_search,
                          int *cost_list, FULLPEL_MV *best_mv,
                          FULLPEL_MV_STATS *best_mv_stats) {
  static const int search_steps[MAX_MVSEARCH_STEPS] = {
    10, 9, 8, 7, 6, 5, 4, 3, 2, 1, 0,
  };
  int i, s, t;

  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site_config *search_sites = ms_params->search_sites;
  const int *num_candidates = search_sites->searches_per_step;
  const int ref_stride = ref->stride;
  const int last_is_4 = num_candidates[0] == 4;
  int br, bc;
  unsigned int bestsad = UINT_MAX, raw_bestsad = UINT_MAX;
  int k = -1;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  search_step = AOMMIN(search_step, MAX_MVSEARCH_STEPS - 1);
  assert(search_step >= 0);
  int best_init_s = search_steps[search_step];
  // adjust ref_mv to make sure it is within MV range
  clamp_fullmv(&start_mv, &ms_params->mv_limits);
  br = start_mv.row;
  bc = start_mv.col;
  if (cost_list != NULL) {
    cost_list[0] = cost_list[1] = cost_list[2] = cost_list[3] = cost_list[4] =
        INT_MAX;
  }
  int costlist_has_sad = 0;

  // Work out the start point for the search
  raw_bestsad = get_mvpred_sad(ms_params, src,
                               get_buf_from_fullmv(ref, &start_mv), ref_stride);
  bestsad = raw_bestsad + mvsad_err_cost_(&start_mv, mv_cost_params);

  // Search all possible scales up to the search param around the center point
  // pick the scale of the point that is best as the starting scale of
  // further steps around it.
  const uint8_t *center_address = get_buf_from_fullmv(ref, &start_mv);
  if (do_init_search) {
    s = best_init_s;
    best_init_s = -1;
    for (t = 0; t <= s; ++t) {
      int best_site = -1;
      FULLPEL_MV center_mv = { br, bc };
      if (check_bounds(&ms_params->mv_limits, br, bc, 1 << t)) {
        // Call 4-point sad for multiples of 4 candidates.
        const int no_of_4_cand_loops = num_candidates[t] >> 2;
        for (i = 0; i < no_of_4_cand_loops; i++) {
          calc_sad4_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                  center_address, &bestsad, &raw_bestsad, t,
                                  &best_site, i * 4, /*cost_list=*/NULL);
        }
        // Rest of the candidates
        const int remaining_cand = num_candidates[t] % 4;
        calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                               center_address, &bestsad, &raw_bestsad, t,
                               &best_site, remaining_cand,
                               no_of_4_cand_loops * 4, NULL);
      } else {
        calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                               center_address, &bestsad, &raw_bestsad, t,
                               &best_site, num_candidates[t], 0, NULL);
      }
      if (best_site == -1) {
        continue;
      } else {
        best_init_s = t;
        k = best_site;
      }
    }
    if (best_init_s != -1) {
      br += search_sites->site[best_init_s][k].mv.row;
      bc += search_sites->site[best_init_s][k].mv.col;
      center_address += search_sites->site[best_init_s][k].offset;
    }
  }

  // If the center point is still the best, just skip this and move to
  // the refinement step.
  if (best_init_s != -1) {
    const int last_s = (last_is_4 && cost_list != NULL);
    int best_site = -1;
    s = best_init_s;

    for (; s >= last_s; s--) {
      // No need to search all points the 1st time if initial search was used
      if (!do_init_search || s != best_init_s) {
        FULLPEL_MV center_mv = { br, bc };
        if (check_bounds(&ms_params->mv_limits, br, bc, 1 << s)) {
          // Call 4-point sad for multiples of 4 candidates.
          const int no_of_4_cand_loops = num_candidates[s] >> 2;
          for (i = 0; i < no_of_4_cand_loops; i++) {
            calc_sad4_update_bestmv(ms_params, mv_cost_params, best_mv,
                                    center_mv, center_address, &bestsad,
                                    &raw_bestsad, s, &best_site, i * 4,
                                    /*cost_list=*/NULL);
          }
          // Rest of the candidates
          const int remaining_cand = num_candidates[s] % 4;
          calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                 center_address, &bestsad, &raw_bestsad, s,
                                 &best_site, remaining_cand,
                                 no_of_4_cand_loops * 4, NULL);
        } else {
          calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                 center_address, &bestsad, &raw_bestsad, s,
                                 &best_site, num_candidates[s], 0, NULL);
        }

        if (best_site == -1) {
          continue;
        } else {
          br += search_sites->site[s][best_site].mv.row;
          bc += search_sites->site[s][best_site].mv.col;
          center_address += search_sites->site[s][best_site].offset;
          k = best_site;
        }
      }

      do {
        int next_chkpts_indices[PATTERN_CANDIDATES_REF];
        best_site = -1;
        next_chkpts_indices[0] = (k == 0) ? num_candidates[s] - 1 : k - 1;
        next_chkpts_indices[1] = k;
        next_chkpts_indices[2] = (k == num_candidates[s] - 1) ? 0 : k + 1;

        FULLPEL_MV center_mv = { br, bc };
        if (check_bounds(&ms_params->mv_limits, br, bc, 1 << s)) {
          calc_sad3_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                  center_address, &bestsad, &raw_bestsad, s,
                                  &best_site, next_chkpts_indices, NULL);
        } else {
          calc_sad_update_bestmv_with_indices(
              ms_params, mv_cost_params, best_mv, center_mv, center_address,
              &bestsad, &raw_bestsad, s, &best_site, PATTERN_CANDIDATES_REF,
              next_chkpts_indices, NULL);
        }

        if (best_site != -1) {
          k = next_chkpts_indices[best_site];
          br += search_sites->site[s][k].mv.row;
          bc += search_sites->site[s][k].mv.col;
          center_address += search_sites->site[s][k].offset;
        }
      } while (best_site != -1);
    }
    // Note: If we enter the if below, then cost_list must be non-NULL.
    if (s == 0) {
      cost_list[0] = raw_bestsad;
      costlist_has_sad = 1;
      assert(num_candidates[s] == 4);
      if (!do_init_search || s != best_init_s) {
        FULLPEL_MV center_mv = { br, bc };
        if (check_bounds(&ms_params->mv_limits, br, bc, 1 << s)) {
          calc_sad4_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                  center_address, &bestsad, &raw_bestsad, s,
                                  &best_site, 0, cost_list);
        } else {
          calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                 center_address, &bestsad, &raw_bestsad, s,
                                 &best_site, /*num_candidates=*/4,
                                 /*cand_start=*/0, cost_list);
        }

        if (best_site != -1) {
          br += search_sites->site[s][best_site].mv.row;
          bc += search_sites->site[s][best_site].mv.col;
          center_address += search_sites->site[s][best_site].offset;
          k = best_site;
        }
      }
      while (best_site != -1) {
        int next_chkpts_indices[PATTERN_CANDIDATES_REF];
        best_site = -1;
        next_chkpts_indices[0] = (k == 0) ? num_candidates[s] - 1 : k - 1;
        next_chkpts_indices[1] = k;
        next_chkpts_indices[2] = (k == num_candidates[s] - 1) ? 0 : k + 1;
        cost_list[1] = cost_list[2] = cost_list[3] = cost_list[4] = INT_MAX;
        cost_list[((k + 2) % 4) + 1] = cost_list[0];
        cost_list[0] = raw_bestsad;

        FULLPEL_MV center_mv = { br, bc };
        if (check_bounds(&ms_params->mv_limits, br, bc, 1 << s)) {
          assert(PATTERN_CANDIDATES_REF == 3);
          calc_sad3_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                  center_address, &bestsad, &raw_bestsad, s,
                                  &best_site, next_chkpts_indices, cost_list);
        } else {
          calc_sad_update_bestmv_with_indices(
              ms_params, mv_cost_params, best_mv, center_mv, center_address,
              &bestsad, &raw_bestsad, s, &best_site, PATTERN_CANDIDATES_REF,
              next_chkpts_indices, cost_list);
        }

        if (best_site != -1) {
          k = next_chkpts_indices[best_site];
          br += search_sites->site[s][k].mv.row;
          bc += search_sites->site[s][k].mv.col;
          center_address += search_sites->site[s][k].offset;
        }
      }
    }
  }
  best_mv->row = br;
  best_mv->col = bc;

  assert(center_address == get_buf_from_fullmv(ref, best_mv) &&
         "center address is out of sync with best_mv!\n");

  // Returns the one-away integer pel cost/sad around the best as follows:
  // cost_list[0]: cost/sad at the best integer pel
  // cost_list[1]: cost/sad at delta {0, -1} (left)   from the best integer pel
  // cost_list[2]: cost/sad at delta { 1, 0} (bottom) from the best integer pel
  // cost_list[3]: cost/sad at delta { 0, 1} (right)  from the best integer pel
  // cost_list[4]: cost/sad at delta {-1, 0} (top)    from the best integer pel
  if (cost_list) {
    if (USE_SAD_COSTLIST) {
      calc_int_sad_list(*best_mv, ms_params, cost_list, costlist_has_sad);
    } else {
      calc_int_cost_list(*best_mv, ms_params, cost_list);
    }
  }

  const int var_cost = get_mvpred_var_cost(ms_params, best_mv, best_mv_stats);
  return var_cost;
}